

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

void art_iterator_insert(art_t *art,art_iterator_t *iterator,art_key_chunk_t *key,art_val_t *val)

{
  art_val_t *in_RCX;
  art_key_chunk_t *in_RDX;
  art_t *in_RSI;
  art_key_chunk_t *in_RDI;
  art_iterator_t *unaff_retaddr;
  
  art_insert(in_RSI,in_RDX,in_RCX);
  *(undefined1 *)((long)&in_RSI[2].root + 1) = 0;
  *(undefined1 *)&in_RSI[2].root = 0;
  art_node_iterator_lower_bound((art_node_t *)val,unaff_retaddr,in_RDI);
  return;
}

Assistant:

void art_iterator_insert(art_t *art, art_iterator_t *iterator,
                         const art_key_chunk_t *key, art_val_t *val) {
    // TODO: This can likely be faster.
    art_insert(art, key, val);
    assert(art->root != NULL);
    iterator->frame = 0;
    iterator->depth = 0;
    art_node_iterator_lower_bound(art->root, iterator, key);
}